

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::ZeroCopyOutputStream::WriteCord(ZeroCopyOutputStream *this,Cord *cord)

{
  byte bVar1;
  Nonnull<cord_internal::CordRep_*> tree;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  char *__src;
  size_t __n;
  int buffer_size;
  void *buffer;
  ChunkIterator __begin2;
  uint local_d4;
  void *local_d0;
  ChunkIterator local_c8;
  
  uVar3 = (ulong)(cord->contents_).data_.rep_.field_0.data[0];
  if ((uVar3 & 1) == 0) {
    uVar3 = uVar3 >> 1;
  }
  else {
    uVar3 = ((cord->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (uVar3 == 0) {
    return true;
  }
  local_d4 = 0;
  iVar2 = (*this->_vptr_ZeroCopyOutputStream[2])(this,&local_d0);
  if ((char)iVar2 == '\0') {
    return false;
  }
  local_c8.current_leaf_ = (Nullable<absl::cord_internal::CordRep_*>)0x0;
  local_c8.bytes_remaining_ = 0;
  local_c8.current_chunk_ = (string_view)ZEXT816(0);
  local_c8.btree_reader_.remaining_ = 0;
  local_c8.btree_reader_.navigator_.height_ = -1;
  bVar1 = (cord->contents_).data_.rep_.field_0.data[0];
  tree = (cord->contents_).data_.rep_.field_0.as_tree.rep;
  if (tree == (Nonnull<cord_internal::CordRep_*>)0x0 || ((long)(char)bVar1 & 1U) == 0) {
    if ((bVar1 & 1) != 0) {
LAB_00235cfa:
      WriteCord();
LAB_00235cff:
      __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                    ,0x611,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
    }
    local_c8.bytes_remaining_ = (ulong)(long)(char)bVar1 >> 1;
    local_c8.current_chunk_._M_str = (char *)((long)&(cord->contents_).data_.rep_.field_0 + 1);
    local_c8.current_chunk_._M_len = local_c8.bytes_remaining_;
  }
  else {
    local_c8.bytes_remaining_ = tree->length;
    if (local_c8.bytes_remaining_ == 0) goto LAB_00235cd0;
    absl::lts_20250127::Cord::ChunkIterator::InitTree(&local_c8,tree);
  }
  if (local_c8.bytes_remaining_ != 0) {
    __n = local_c8.current_chunk_._M_len;
    do {
      __src = local_c8.current_chunk_._M_str;
      while ((ulong)(long)(int)local_d4 < __n) {
        memcpy(local_d0,__src,(long)(int)local_d4);
        __src = __src + (int)local_d4;
        __n = __n - (long)(int)local_d4;
        iVar2 = (*this->_vptr_ZeroCopyOutputStream[2])(this,&local_d0,&local_d4);
        if ((char)iVar2 == '\0') {
          return false;
        }
      }
      memcpy(local_d0,__src,__n);
      local_d0 = (void *)((long)local_d0 + __n);
      local_d4 = local_d4 - (int)__n;
      if (local_c8.bytes_remaining_ == 0) {
        WriteCord();
        goto LAB_00235cfa;
      }
      sVar4 = local_c8.bytes_remaining_ - local_c8.current_chunk_._M_len;
      if (local_c8.bytes_remaining_ < local_c8.current_chunk_._M_len) goto LAB_00235cff;
      __n = local_c8.bytes_remaining_;
      local_c8.bytes_remaining_ = sVar4;
      if (sVar4 != 0) {
        if (((long)local_c8.btree_reader_.navigator_.height_ < 0) ||
           (local_c8.btree_reader_.navigator_.node_[local_c8.btree_reader_.navigator_.height_] ==
            (CordRepBtree *)0x0)) {
          if (local_c8.current_chunk_._M_len == 0) {
            __assert_fail("!current_chunk_.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                          ,0x617,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
          }
          local_c8.current_chunk_ = (string_view)ZEXT816(0);
          __n = 0;
        }
        else {
          local_c8.current_chunk_ =
               absl::lts_20250127::cord_internal::CordRepBtreeReader::Next(&local_c8.btree_reader_);
          __n = local_c8.current_chunk_._M_len;
        }
      }
    } while (local_c8.bytes_remaining_ != 0);
  }
LAB_00235cd0:
  (*this->_vptr_ZeroCopyOutputStream[3])(this,(ulong)local_d4);
  return true;
}

Assistant:

bool ZeroCopyOutputStream::WriteCord(const absl::Cord& cord) {
  if (cord.empty()) return true;

  void* buffer;
  int buffer_size = 0;
  if (!Next(&buffer, &buffer_size)) return false;

  for (absl::string_view fragment : cord.Chunks()) {
    while (fragment.size() > static_cast<size_t>(buffer_size)) {
      std::memcpy(buffer, fragment.data(), buffer_size);

      fragment.remove_prefix(buffer_size);

      if (!Next(&buffer, &buffer_size)) return false;
    }
    std::memcpy(buffer, fragment.data(), fragment.size());

    // Advance the buffer.
    buffer = static_cast<char*>(buffer) + fragment.size();
    buffer_size -= static_cast<int>(fragment.size());
  }
  BackUp(buffer_size);
  return true;
}